

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O2

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  ulong uVar19;
  undefined1 *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long in_FS_OFFSET;
  uint64_t m [16];
  undefined1 *local_138 [8];
  ulong local_f8 [8];
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  local_b8._0_4_ = 0xaaaaaaaa;
  local_b8._4_4_ = 0xaaaaaaaa;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
    (&local_b8)[lVar16] = *(undefined8 *)(block + lVar16 * 8);
  }
  local_138[6] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[7] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[4] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[5] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[2] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[3] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[0] = &DAT_aaaaaaaaaaaaaaaa;
  local_138[1] = &DAT_aaaaaaaaaaaaaaaa;
  for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
    local_138[lVar16] = (undefined1 *)S->h[lVar16];
  }
  lVar16 = CONCAT44(local_b8._4_4_,(undefined4)local_b8);
  lVar1 = CONCAT44(uStack_ac,uStack_b0);
  puVar17 = local_138[0] + (long)local_138[4] + lVar16;
  uVar19 = (ulong)puVar17 ^ S->t[0] ^ 0x510e527fade682d1;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = uVar19 + 0x6a09e667f3bcc908;
  uVar28 = (ulong)local_138[4] ^ local_f8[0];
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar17 = puVar17 + uVar28 + lVar1;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar28 = uVar28 ^ local_f8[0];
  uVar29 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  lVar2 = CONCAT44(uStack_a4,local_a8);
  puVar20 = local_138[1] + (long)local_138[5] + lVar2;
  uVar28 = S->t[1] ^ (ulong)puVar20 ^ 0x9b05688c2b3e6c1f;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  lVar4 = CONCAT44(uStack_94,local_98);
  puVar27 = local_138[2] + (long)local_138[6] + lVar4;
  uVar21 = S->f[0] ^ (ulong)puVar27 ^ 0x1f83d9abfb41bd6b;
  local_f8[1] = uVar28 + 0xbb67ae8584caa73b;
  uVar24 = (ulong)local_138[5] ^ local_f8[1];
  uVar25 = uVar24 << 0x28 | uVar24 >> 0x18;
  lVar3 = CONCAT44(uStack_9c,uStack_a0);
  puVar20 = puVar20 + uVar25 + lVar3;
  uVar28 = uVar28 ^ (ulong)puVar20;
  uVar24 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar25 = uVar25 ^ local_f8[1];
  uVar26 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  lVar6 = CONCAT44(uStack_84,local_88);
  puVar18 = local_138[3] + (long)local_138[7] + lVar6;
  uVar28 = S->f[1] ^ (ulong)puVar18 ^ 0x5be0cd19137e2179;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[2] = uVar21 + 0x3c6ef372fe94f82b;
  uVar25 = (ulong)local_138[6] ^ local_f8[2];
  uVar22 = uVar25 << 0x28 | uVar25 >> 0x18;
  lVar5 = CONCAT44(uStack_8c,uStack_90);
  puVar27 = puVar27 + uVar22 + lVar5;
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar25 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = uVar28 + 0xa54ff53a5f1d36f1;
  uVar21 = (ulong)local_138[7] ^ local_f8[3];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  lVar7 = CONCAT44(uStack_7c,uStack_80);
  puVar18 = puVar18 + uVar21 + lVar7;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  lVar8 = CONCAT44(uStack_74,local_78);
  puVar17 = puVar17 + uVar26 + lVar8;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  lVar9 = CONCAT44(uStack_6c,uStack_70);
  puVar17 = puVar17 + uVar26 + lVar9;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  lVar10 = CONCAT44(uStack_64,local_68);
  puVar20 = puVar20 + uVar22 + lVar10;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  lVar11 = CONCAT44(uStack_5c,uStack_60);
  puVar20 = puVar20 + uVar22 + lVar11;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  lVar12 = CONCAT44(uStack_54,local_58);
  puVar27 = puVar27 + uVar21 + lVar12;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  lVar13 = CONCAT44(uStack_4c,uStack_50);
  puVar27 = puVar27 + uVar21 + lVar13;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  lVar14 = CONCAT44(uStack_44,local_48);
  puVar18 = puVar18 + uVar29 + lVar14;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  lVar15 = CONCAT44(uStack_3c,uStack_40);
  puVar18 = puVar18 + uVar29 + lVar15;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + uVar29 + lVar14;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar10;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar20 = puVar20 + uVar26 + lVar4;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar26 + lVar8;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar27 = puVar27 + uVar22 + lVar9;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar27 = puVar27 + uVar22 + lVar15;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar18 = puVar18 + uVar21 + lVar13;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar18 = puVar18 + uVar21 + lVar6;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar17 = puVar17 + uVar26 + lVar1;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar17 = puVar17 + uVar26 + lVar12;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar20 = puVar20 + uVar22 + lVar16;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar20 = puVar20 + uVar22 + lVar2;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar27 = puVar27 + uVar21 + lVar11;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar27 = puVar27 + uVar21 + lVar7;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar18 = puVar18 + uVar29 + lVar5;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + uVar29 + lVar3;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + uVar29 + lVar11;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar8;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar20 = puVar20 + uVar26 + lVar12;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar26 + lVar16;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar27 = puVar27 + uVar22 + lVar5;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar27 = puVar27 + uVar22 + lVar2;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar18 = puVar18 + uVar21 + lVar15;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar18 = puVar18 + uVar21 + lVar13;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar17 = puVar17 + uVar26 + lVar10;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar17 = puVar17 + uVar26 + lVar14;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar20 = puVar20 + uVar22 + lVar3;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar20 = puVar20 + uVar22 + lVar6;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar27 = puVar27 + uVar21 + lVar7;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar27 = puVar27 + uVar21 + lVar1;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar18 = puVar18 + uVar29 + lVar9;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + uVar29 + lVar4;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + uVar29 + lVar7;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar9;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar20 = puVar20 + uVar26 + lVar3;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar26 + lVar1;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar27 = puVar27 + uVar22 + lVar13;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar27 = puVar27 + uVar22 + lVar12;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar18 = puVar18 + uVar21 + lVar11;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar18 = puVar18 + uVar21 + lVar14;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar17 = puVar17 + uVar26 + lVar2;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar17 = puVar17 + uVar26 + lVar6;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar20 = puVar20 + uVar22 + lVar5;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar20 = puVar20 + uVar22 + lVar10;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar27 = puVar27 + uVar21 + lVar4;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar27 = puVar27 + uVar21 + lVar16;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar18 = puVar18 + uVar29 + lVar15;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + uVar29 + lVar8;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + uVar29 + lVar9;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar16;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar30 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar20 = puVar20 + uVar26 + lVar5;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar26 + lVar7;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar26 = uVar26 ^ local_f8[1];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar27 = puVar27 + uVar22 + lVar2;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar18 = puVar18 + uVar21 + lVar10;
  uVar28 = uVar28 ^ (ulong)puVar18;
  puVar27 = puVar27 + uVar22 + lVar4;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[2] = local_f8[2] + uVar25;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar18 = puVar18 + uVar21 + lVar15;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  puVar17 = puVar17 + uVar26 + lVar14;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar26 = uVar26 ^ local_f8[2];
  uVar29 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar1;
  uVar28 = uVar28 ^ (ulong)puVar17;
  puVar20 = puVar20 + uVar22 + lVar11;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar22 = uVar22 ^ local_f8[3];
  uVar26 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar20 = puVar20 + uVar26 + lVar12;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  puVar18 = puVar18 + uVar30 + lVar3;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar30 = uVar30 ^ local_f8[1];
  uVar30 = uVar30 << 0x28 | uVar30 >> 0x18;
  puVar18 = puVar18 + uVar30 + lVar13;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar22 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar22;
  uVar30 = uVar30 ^ local_f8[1];
  uVar30 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  local_f8[3] = local_f8[3] + uVar19;
  puVar17 = puVar17 + uVar30 + lVar2;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = local_f8[2] + uVar28;
  uVar29 = uVar29 ^ local_f8[2];
  uVar25 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar27 = puVar27 + uVar21 + lVar6;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar27 = puVar27 + uVar21 + lVar8;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  puVar20 = puVar20 + uVar25 + lVar6;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar26 = uVar26 ^ local_f8[3];
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar27 = puVar27 + uVar26 + lVar16;
  uVar22 = uVar22 ^ (ulong)puVar27;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar18 = puVar18 + uVar21 + lVar8;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar30 = uVar30 ^ local_f8[0];
  uVar31 = uVar30 << 0x28 | uVar30 >> 0x18;
  puVar17 = puVar17 + uVar31 + lVar12;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar25 = uVar25 ^ local_f8[1];
  uVar25 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar20 = puVar20 + uVar25 + lVar10;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[1] + uVar24;
  uVar25 = uVar25 ^ local_f8[1];
  uVar29 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar21 = uVar21 ^ local_f8[3];
  uVar25 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar18 = puVar18 + uVar25 + lVar3;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  puVar17 = puVar17 + uVar29 + lVar4;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar21 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[2] = local_f8[2] + uVar21;
  uVar26 = uVar26 ^ local_f8[2];
  uVar26 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar27 = puVar27 + uVar26 + lVar11;
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar22 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[2] = local_f8[2] + uVar22;
  uVar26 = uVar26 ^ local_f8[2];
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar29 = uVar29 ^ local_f8[2];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar29 + lVar13;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar21 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = uVar21 + local_f8[2];
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  uVar25 = uVar25 ^ local_f8[3];
  uVar29 = uVar29 ^ local_f8[2];
  uVar30 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_7c,uStack_80) + uVar26;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar28 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar26 = uVar26 ^ local_f8[3];
  uVar19 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar20 = puVar20 + uVar19 + CONCAT44(uStack_8c,uStack_90);
  uVar28 = uVar28 ^ (ulong)puVar20;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar28;
  uVar19 = local_f8[3] ^ uVar19;
  uVar31 = uVar31 ^ local_f8[0];
  uVar26 = uVar31 << 1 | (ulong)((long)uVar31 < 0);
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar18 = puVar18 + uVar26 + lVar1;
  uVar22 = uVar22 ^ (ulong)puVar18;
  uVar22 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[1] = local_f8[1] + uVar22;
  uVar26 = uVar26 ^ local_f8[1];
  uVar29 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar27 = puVar27 + uVar25 + CONCAT44(uStack_3c,uStack_40);
  puVar18 = puVar18 + CONCAT44(uStack_6c,uStack_70) + uVar29;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar22 = uVar22 ^ (ulong)puVar18;
  uVar26 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_f8[1] = local_f8[1] + uVar26;
  uVar29 = uVar29 ^ local_f8[1];
  uVar31 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + uVar31 + CONCAT44(uStack_54,local_58);
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar25 = uVar25 ^ local_f8[0];
  uVar22 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar27 = puVar27 + uVar22 + lVar14;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar25 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = local_f8[0] + uVar25;
  uVar22 = uVar22 ^ local_f8[0];
  uVar29 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[0] = local_f8[0] + uVar28;
  uVar31 = uVar31 ^ local_f8[0];
  uVar24 = uVar31 << 0x28 | uVar31 >> 0x18;
  puVar17 = puVar17 + uVar24 + CONCAT44(uStack_8c,uStack_90);
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar28 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[0] = uVar28 + local_f8[0];
  uVar24 = local_f8[0] ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_ac,uStack_b0) + uVar30;
  uVar25 = uVar25 ^ (ulong)puVar20;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar30 = uVar30 ^ local_f8[1];
  uVar22 = uVar30 << 0x28 | uVar30 >> 0x18;
  puVar20 = puVar20 + uVar22 + CONCAT44(uStack_3c,uStack_40);
  uVar25 = uVar25 ^ (ulong)puVar20;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = uVar25 + local_f8[1];
  uVar22 = local_f8[1] ^ uVar22;
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_44,local_48) + uVar19;
  uVar26 = uVar26 ^ (ulong)puVar27;
  uVar26 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[2] = local_f8[2] + uVar26;
  uVar19 = uVar19 ^ local_f8[2];
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_4c,uStack_50) + uVar19;
  uVar26 = uVar26 ^ (ulong)puVar27;
  uVar26 = uVar26 << 0x30 | uVar26 >> 0x10;
  local_f8[2] = uVar26 + local_f8[2];
  uVar19 = uVar19 ^ local_f8[2];
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_94,local_98) + uVar29;
  uVar21 = uVar21 ^ (ulong)puVar18;
  uVar30 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[3] = local_f8[3] + uVar30;
  uVar29 = uVar29 ^ local_f8[3];
  uVar21 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_64,local_68) + uVar21;
  uVar30 = uVar30 ^ (ulong)puVar18;
  uVar30 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_f8[3] = local_f8[3] + uVar30;
  uVar21 = uVar21 ^ local_f8[3];
  uVar29 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar17 = puVar17 + CONCAT44(local_b8._4_4_,(undefined4)local_b8) + uVar22;
  uVar30 = uVar30 ^ (ulong)puVar17;
  uVar30 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[2] = local_f8[2] + uVar30;
  uVar22 = uVar22 ^ local_f8[2];
  uVar21 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_7c,uStack_80) + uVar21;
  uVar30 = uVar30 ^ (ulong)puVar17;
  uVar23 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_f8[2] = uVar23 + local_f8[2];
  uVar21 = local_f8[2] ^ uVar21;
  uVar31 = uVar21 << 1 | (ulong)((long)uVar21 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_84,local_88) + uVar19;
  uVar28 = uVar28 ^ (ulong)puVar20;
  uVar28 = uVar28 << 0x20 | uVar28 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar19 = uVar19 ^ local_f8[3];
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_9c,uStack_a0) + uVar19;
  uVar28 = uVar28 ^ (ulong)puVar20;
  uVar30 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar30;
  uVar19 = local_f8[3] ^ uVar19;
  uVar28 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_6c,uStack_70) + uVar29;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar29 = uVar29 ^ local_f8[0];
  uVar25 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_a4,local_a8) + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar27;
  uVar21 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar21;
  uVar25 = uVar25 ^ local_f8[0];
  uVar22 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_74,local_78) + uVar24;
  uVar26 = uVar26 ^ (ulong)puVar18;
  uVar25 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar24 = uVar24 ^ local_f8[1];
  uVar19 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar18 = puVar18 + uVar19 + CONCAT44(uStack_5c,uStack_60);
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar19 = uVar19 ^ local_f8[1];
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_4c,uStack_50) + uVar19;
  uVar30 = uVar30 ^ (ulong)puVar17;
  uVar24 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[0] = local_f8[0] + uVar24;
  uVar19 = uVar19 ^ local_f8[0];
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar17 = puVar17 + uVar19 + CONCAT44(uStack_5c,uStack_60);
  uVar24 = uVar24 ^ (ulong)puVar17;
  uVar26 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[0] = uVar26 + local_f8[0];
  uVar19 = local_f8[0] ^ uVar19;
  uVar29 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_7c,uStack_80) + uVar31;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar19 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[1] = local_f8[1] + uVar19;
  uVar31 = uVar31 ^ local_f8[1];
  uVar24 = uVar31 << 0x28 | uVar31 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_44,local_48) + uVar24;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[1] = uVar19 + local_f8[1];
  uVar24 = local_f8[1] ^ uVar24;
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_54,local_58) + uVar28;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar21 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar21;
  uVar28 = uVar28 ^ local_f8[2];
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_ac,uStack_b0) + uVar28;
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[2] = uVar21 + local_f8[2];
  uVar28 = uVar28 ^ local_f8[2];
  uVar30 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_9c,uStack_a0) + uVar22;
  uVar23 = uVar23 ^ (ulong)puVar18;
  uVar25 = uVar23 << 0x20 | uVar23 >> 0x20;
  local_f8[3] = local_f8[3] + uVar25;
  uVar22 = uVar22 ^ local_f8[3];
  uVar28 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_6c,uStack_70) + uVar28;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar22 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[3] = local_f8[3] + uVar22;
  uVar28 = uVar28 ^ local_f8[3];
  uVar25 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_8c,uStack_90) + uVar24;
  uVar22 = uVar22 ^ (ulong)puVar17;
  uVar22 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[2] = local_f8[2] + uVar22;
  uVar24 = uVar24 ^ local_f8[2];
  uVar28 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar17 = puVar17 + CONCAT44(local_b8._4_4_,(undefined4)local_b8) + uVar28;
  uVar22 = uVar22 ^ (ulong)puVar17;
  uVar31 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_f8[2] = uVar31 + local_f8[2];
  uVar28 = local_f8[2] ^ uVar28;
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar20 = puVar20 + uVar30 + CONCAT44(uStack_3c,uStack_40);
  uVar26 = uVar26 ^ (ulong)puVar20;
  uVar22 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[3] = local_f8[3] + uVar22;
  uVar30 = uVar30 ^ local_f8[3];
  uVar24 = uVar30 << 0x28 | uVar30 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_94,local_98) + uVar24;
  uVar22 = uVar22 ^ (ulong)puVar20;
  uVar26 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_f8[3] = local_f8[3] + uVar26;
  uVar24 = local_f8[3] ^ uVar24;
  uVar22 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_74,local_78) + uVar25;
  uVar19 = uVar19 ^ (ulong)puVar27;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar25 = uVar25 ^ local_f8[0];
  uVar24 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar27 = puVar27 + uVar24 + CONCAT44(uStack_84,local_88);
  uVar19 = uVar19 ^ (ulong)puVar27;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[0] + uVar19;
  uVar24 = uVar24 ^ local_f8[0];
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_a4,local_a8) + uVar29;
  uVar21 = uVar21 ^ (ulong)puVar18;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[1] = local_f8[1] + uVar21;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_64,local_68) + uVar29;
  uVar21 = uVar21 ^ (ulong)puVar18;
  uVar25 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_84,local_88) + uVar29;
  uVar26 = uVar26 ^ (ulong)puVar17;
  uVar21 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[0] = local_f8[0] + uVar21;
  uVar29 = uVar29 ^ local_f8[0];
  uVar26 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + uVar26 + CONCAT44(uStack_3c,uStack_40);
  uVar21 = uVar21 ^ (ulong)puVar17;
  uVar30 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[0] = uVar30 + local_f8[0];
  uVar26 = local_f8[0] ^ uVar26;
  uVar29 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_44,local_48) + uVar28;
  uVar19 = uVar19 ^ (ulong)puVar20;
  uVar21 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[1] = local_f8[1] + uVar21;
  uVar28 = uVar28 ^ local_f8[1];
  uVar19 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_6c,uStack_70) + uVar19;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[1] = uVar21 + local_f8[1];
  uVar19 = local_f8[1] ^ uVar19;
  uVar28 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_5c,uStack_60) + uVar22;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar19 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[2] = local_f8[2] + uVar19;
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_9c,uStack_a0) + uVar22;
  uVar19 = uVar19 ^ (ulong)puVar27;
  uVar25 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[2] = uVar25 + local_f8[2];
  uVar22 = uVar22 ^ local_f8[2];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar18 = puVar18 + CONCAT44(local_b8._4_4_,(undefined4)local_b8) + uVar24;
  uVar31 = uVar31 ^ (ulong)puVar18;
  uVar26 = uVar31 << 0x20 | uVar31 >> 0x20;
  local_f8[3] = local_f8[3] + uVar26;
  uVar24 = uVar24 ^ local_f8[3];
  uVar19 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_74,local_78) + uVar19;
  uVar26 = uVar26 ^ (ulong)puVar18;
  uVar26 = uVar26 << 0x30 | uVar26 >> 0x10;
  local_f8[3] = local_f8[3] + uVar26;
  uVar19 = uVar19 ^ local_f8[3];
  uVar24 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_54,local_58) + uVar28;
  uVar26 = uVar26 ^ (ulong)puVar17;
  uVar26 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[2] = local_f8[2] + uVar26;
  uVar28 = uVar28 ^ local_f8[2];
  uVar19 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_a4,local_a8) + uVar19;
  uVar26 = uVar26 ^ (ulong)puVar17;
  uVar26 = uVar26 << 0x30 | uVar26 >> 0x10;
  local_f8[2] = uVar26 + local_f8[2];
  uVar19 = local_f8[2] ^ uVar19;
  uVar28 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_4c,uStack_50) + uVar22;
  uVar30 = uVar30 ^ (ulong)puVar20;
  uVar30 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[3] = local_f8[3] + uVar30;
  uVar22 = uVar22 ^ local_f8[3];
  uVar19 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_7c,uStack_80) + uVar19;
  uVar30 = uVar30 ^ (ulong)puVar20;
  uVar30 = uVar30 << 0x30 | uVar30 >> 0x10;
  local_f8[3] = local_f8[3] + uVar30;
  uVar19 = local_f8[3] ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_ac,uStack_b0) + uVar24;
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[0] = local_f8[0] + uVar21;
  uVar24 = uVar24 ^ local_f8[0];
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar27 = puVar27 + uVar24 + CONCAT44(uStack_94,local_98);
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[0] = local_f8[0] + uVar21;
  uVar24 = uVar24 ^ local_f8[0];
  uVar24 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_64,local_68) + uVar29;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar25 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_8c,uStack_90) + uVar29;
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar22 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar22;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_64,local_68) + uVar29;
  uVar30 = uVar30 ^ (ulong)puVar17;
  uVar25 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[0] = local_f8[0] + uVar25;
  uVar29 = uVar29 ^ local_f8[0];
  uVar30 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_a4,local_a8) + uVar30;
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar29 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[0] = uVar29 + local_f8[0];
  uVar30 = local_f8[0] ^ uVar30;
  uVar31 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_74,local_78) + uVar28;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[1] = local_f8[1] + uVar21;
  uVar28 = uVar28 ^ local_f8[1];
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar20 = puVar20 + uVar28 + CONCAT44(uStack_94,local_98);
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar25 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[1] = uVar25 + local_f8[1];
  uVar28 = local_f8[1] ^ uVar28;
  uVar21 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_7c,uStack_80) + uVar19;
  uVar22 = uVar22 ^ (ulong)puVar27;
  uVar28 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar19 = uVar19 ^ local_f8[2];
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_84,local_88) + uVar19;
  uVar28 = uVar28 ^ (ulong)puVar27;
  uVar22 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = uVar22 + local_f8[2];
  uVar19 = uVar19 ^ local_f8[2];
  uVar23 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_ac,uStack_b0) + uVar24;
  uVar26 = uVar26 ^ (ulong)puVar18;
  uVar28 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[3] = local_f8[3] + uVar28;
  uVar24 = uVar24 ^ local_f8[3];
  uVar19 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_8c,uStack_90) + uVar19;
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar24 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[3] = local_f8[3] + uVar24;
  uVar19 = uVar19 ^ local_f8[3];
  uVar28 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_3c,uStack_40) + uVar21;
  uVar24 = uVar24 ^ (ulong)puVar17;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[2] = local_f8[2] + uVar24;
  uVar21 = uVar21 ^ local_f8[2];
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_5c,uStack_60) + uVar19;
  uVar24 = uVar24 ^ (ulong)puVar17;
  uVar30 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[2] = uVar30 + local_f8[2];
  uVar19 = local_f8[2] ^ uVar19;
  uVar24 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_6c,uStack_70) + uVar23;
  uVar29 = uVar29 ^ (ulong)puVar20;
  uVar21 = uVar29 << 0x20 | uVar29 >> 0x20;
  local_f8[3] = local_f8[3] + uVar21;
  uVar23 = uVar23 ^ local_f8[3];
  uVar19 = uVar23 << 0x28 | uVar23 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_44,local_48) + uVar19;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar26 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[3] = local_f8[3] + uVar26;
  uVar19 = local_f8[3] ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar27 = puVar27 + uVar28 + CONCAT44(uStack_9c,uStack_a0);
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar21 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[0] = local_f8[0] + uVar21;
  uVar28 = uVar28 ^ local_f8[0];
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_54,local_58) + uVar28;
  uVar21 = uVar21 ^ (ulong)puVar27;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[0] = local_f8[0] + uVar21;
  uVar28 = uVar28 ^ local_f8[0];
  uVar28 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_4c,uStack_50) + uVar31;
  uVar22 = uVar22 ^ (ulong)puVar18;
  uVar25 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[1] = local_f8[1] + uVar25;
  uVar31 = uVar31 ^ local_f8[1];
  uVar29 = uVar31 << 0x28 | uVar31 >> 0x18;
  puVar18 = puVar18 + uVar29 + CONCAT44(local_b8._4_4_,(undefined4)local_b8);
  uVar25 = uVar25 ^ (ulong)puVar18;
  uVar22 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[1] = local_f8[1] + uVar22;
  uVar29 = uVar29 ^ local_f8[1];
  uVar29 = uVar29 << 1 | (ulong)((long)uVar29 < 0);
  puVar17 = puVar17 + CONCAT44(local_b8._4_4_,(undefined4)local_b8) + uVar29;
  uVar26 = uVar26 ^ (ulong)puVar17;
  uVar25 = uVar26 << 0x20 | uVar26 >> 0x20;
  local_f8[0] = local_f8[0] + uVar25;
  uVar29 = uVar29 ^ local_f8[0];
  uVar26 = uVar29 << 0x28 | uVar29 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_ac,uStack_b0) + uVar26;
  uVar25 = uVar25 ^ (ulong)puVar17;
  uVar29 = uVar25 << 0x30 | uVar25 >> 0x10;
  local_f8[0] = uVar29 + local_f8[0];
  uVar26 = local_f8[0] ^ uVar26;
  uVar26 = uVar26 << 1 | (ulong)((long)uVar26 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_a4,local_a8) + uVar24;
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[1] = local_f8[1] + uVar21;
  uVar24 = uVar24 ^ local_f8[1];
  uVar24 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar20 = puVar20 + uVar24 + CONCAT44(uStack_9c,uStack_a0);
  uVar21 = uVar21 ^ (ulong)puVar20;
  uVar25 = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[1] = uVar25 + local_f8[1];
  uVar24 = local_f8[1] ^ uVar24;
  uVar21 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_94,local_98) + uVar19;
  uVar22 = uVar22 ^ (ulong)puVar27;
  uVar24 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[2] = local_f8[2] + uVar24;
  uVar19 = uVar19 ^ local_f8[2];
  uVar19 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_8c,uStack_90) + uVar19;
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar22 = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[2] = uVar22 + local_f8[2];
  uVar19 = uVar19 ^ local_f8[2];
  uVar24 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_84,local_88) + uVar28;
  uVar30 = uVar30 ^ (ulong)puVar18;
  uVar19 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[3] = local_f8[3] + uVar19;
  uVar28 = uVar28 ^ local_f8[3];
  uVar28 = uVar28 << 0x28 | uVar28 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_7c,uStack_80) + uVar28;
  uVar19 = uVar19 ^ (ulong)puVar18;
  uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[3] = local_f8[3] + uVar19;
  uVar28 = uVar28 ^ local_f8[3];
  uVar30 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_74,local_78) + uVar21;
  uVar19 = uVar19 ^ (ulong)puVar17;
  uVar28 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[2] = local_f8[2] + uVar28;
  uVar21 = uVar21 ^ local_f8[2];
  uVar19 = uVar21 << 0x28 | uVar21 >> 0x18;
  puVar17 = puVar17 + CONCAT44(uStack_6c,uStack_70) + uVar19;
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar21 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[2] = uVar21 + local_f8[2];
  uVar19 = local_f8[2] ^ uVar19;
  uVar19 = uVar19 << 1 | (ulong)((long)uVar19 < 0);
  puVar20 = puVar20 + uVar24 + CONCAT44(uStack_64,local_68);
  uVar29 = uVar29 ^ (ulong)puVar20;
  uVar29 = uVar29 << 0x20 | uVar29 >> 0x20;
  local_f8[3] = local_f8[3] + uVar29;
  uVar24 = uVar24 ^ local_f8[3];
  uVar28 = uVar24 << 0x28 | uVar24 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_5c,uStack_60) + uVar28;
  uVar29 = uVar29 ^ (ulong)puVar20;
  uVar29 = uVar29 << 0x30 | uVar29 >> 0x10;
  local_f8[3] = local_f8[3] + uVar29;
  uVar28 = local_f8[3] ^ uVar28;
  uVar31 = uVar28 << 1 | (ulong)((long)uVar28 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_54,local_58) + uVar30;
  uVar25 = uVar25 ^ (ulong)puVar27;
  uVar28 = uVar25 << 0x20 | uVar25 >> 0x20;
  local_f8[0] = local_f8[0] + uVar28;
  uVar30 = uVar30 ^ local_f8[0];
  uVar25 = uVar30 << 0x28 | uVar30 >> 0x18;
  puVar27 = puVar27 + CONCAT44(uStack_4c,uStack_50) + uVar25;
  uVar28 = uVar28 ^ (ulong)puVar27;
  uVar24 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[0] = local_f8[0] + uVar24;
  uVar25 = uVar25 ^ local_f8[0];
  uVar25 = uVar25 << 1 | (ulong)((long)uVar25 < 0);
  puVar18 = puVar18 + CONCAT44(uStack_44,local_48) + uVar26;
  uVar22 = uVar22 ^ (ulong)puVar18;
  uVar28 = uVar22 << 0x20 | uVar22 >> 0x20;
  local_f8[1] = local_f8[1] + uVar28;
  uVar26 = uVar26 ^ local_f8[1];
  uVar22 = uVar26 << 0x28 | uVar26 >> 0x18;
  puVar18 = puVar18 + uVar22 + CONCAT44(uStack_3c,uStack_40);
  uVar28 = uVar28 ^ (ulong)puVar18;
  uVar30 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[1] = local_f8[1] + uVar30;
  uVar22 = uVar22 ^ local_f8[1];
  uVar22 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar17 = puVar17 + CONCAT44(uStack_44,local_48) + uVar22;
  uVar29 = uVar29 ^ (ulong)puVar17;
  uVar28 = uVar29 << 0x20 | uVar29 >> 0x20;
  local_f8[0] = local_f8[0] + uVar28;
  uVar22 = uVar22 ^ local_f8[0];
  uVar22 = uVar22 << 0x28 | uVar22 >> 0x18;
  puVar17 = puVar17 + uVar22 + CONCAT44(uStack_64,local_68);
  uVar28 = uVar28 ^ (ulong)puVar17;
  uVar29 = uVar28 << 0x30 | uVar28 >> 0x10;
  local_f8[0] = uVar29 + local_f8[0];
  uVar22 = local_f8[0] ^ uVar22;
  uVar28 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  puVar20 = puVar20 + CONCAT44(uStack_94,local_98) + uVar19;
  uVar24 = uVar24 ^ (ulong)puVar20;
  uVar22 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar22;
  uVar19 = uVar19 ^ local_f8[1];
  uVar24 = uVar19 << 0x28 | uVar19 >> 0x18;
  puVar20 = puVar20 + CONCAT44(uStack_74,local_78) + uVar24;
  uVar22 = uVar22 ^ (ulong)puVar20;
  uVar19 = uVar22 << 0x30 | uVar22 >> 0x10;
  local_f8[1] = uVar19 + local_f8[1];
  uVar24 = local_f8[1] ^ uVar24;
  uVar26 = uVar24 << 1 | (ulong)((long)uVar24 < 0);
  puVar27 = puVar27 + CONCAT44(uStack_6c,uStack_70) + uVar31;
  uVar30 = uVar30 ^ (ulong)puVar27;
  uVar24 = uVar30 << 0x20 | uVar30 >> 0x20;
  local_f8[2] = local_f8[2] + uVar24;
  uVar31 = uVar31 ^ local_f8[2];
  uVar30 = uVar31 << 0x28 | uVar31 >> 0x18;
  puVar27 = puVar27 + uVar30 + CONCAT44(uStack_3c,uStack_40);
  uVar24 = uVar24 ^ (ulong)puVar27;
  uVar24 = uVar24 << 0x30 | uVar24 >> 0x10;
  puVar18 = puVar18 + CONCAT44(uStack_4c,uStack_50) + uVar25;
  uVar21 = uVar21 ^ (ulong)puVar18;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[3] = local_f8[3] + uVar21;
  uVar25 = uVar25 ^ local_f8[3];
  uVar22 = uVar25 << 0x28 | uVar25 >> 0x18;
  puVar18 = puVar18 + CONCAT44(uStack_84,local_88) + uVar22;
  local_f8[2] = uVar24 + local_f8[2];
  uVar21 = uVar21 ^ (ulong)puVar18;
  uVar21 = uVar21 << 0x30 | uVar21 >> 0x10;
  uVar30 = uVar30 ^ local_f8[2];
  puVar17 = puVar17 + CONCAT44(uStack_ac,uStack_b0) + uVar26;
  local_f8[3] = local_f8[3] + uVar21;
  uVar21 = uVar21 ^ (ulong)puVar17;
  uVar21 = uVar21 << 0x20 | uVar21 >> 0x20;
  local_f8[2] = local_f8[2] + uVar21;
  uVar26 = uVar26 ^ local_f8[2];
  uVar25 = uVar26 << 0x28 | uVar26 >> 0x18;
  local_138[0] = puVar17 + CONCAT44(uStack_54,local_58) + uVar25;
  uVar21 = (ulong)(puVar17 + CONCAT44(uStack_54,local_58) + uVar25) ^ uVar21;
  local_f8[7] = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[2] = local_f8[7] + local_f8[2];
  uVar26 = uVar30 << 1 | (ulong)((long)uVar30 < 0);
  uVar25 = local_f8[2] ^ uVar25;
  uVar22 = uVar22 ^ local_f8[3];
  local_138[5] = (undefined1 *)(uVar25 << 1 | (ulong)((long)uVar25 < 0));
  puVar20 = puVar20 + CONCAT44(local_b8._4_4_,(undefined4)local_b8) + uVar26;
  uVar29 = uVar29 ^ (ulong)puVar20;
  uVar21 = uVar29 << 0x20 | uVar29 >> 0x20;
  local_f8[3] = local_f8[3] + uVar21;
  uVar26 = uVar26 ^ local_f8[3];
  uVar25 = uVar26 << 0x28 | uVar26 >> 0x18;
  local_138[1] = puVar20 + CONCAT44(uStack_a4,local_a8) + uVar25;
  uVar21 = (ulong)(puVar20 + CONCAT44(uStack_a4,local_a8) + uVar25) ^ uVar21;
  local_f8[4] = uVar21 << 0x30 | uVar21 >> 0x10;
  local_f8[3] = local_f8[4] + local_f8[3];
  uVar21 = uVar22 << 1 | (ulong)((long)uVar22 < 0);
  uVar25 = local_f8[3] ^ uVar25;
  local_138[6] = (undefined1 *)(uVar25 << 1 | (ulong)((long)uVar25 < 0));
  puVar27 = puVar27 + CONCAT44(uStack_5c,uStack_60) + uVar21;
  uVar19 = uVar19 ^ (ulong)puVar27;
  uVar19 = uVar19 << 0x20 | uVar19 >> 0x20;
  local_f8[0] = local_f8[0] + uVar19;
  uVar21 = uVar21 ^ local_f8[0];
  uVar21 = uVar21 << 0x28 | uVar21 >> 0x18;
  local_138[2] = puVar27 + CONCAT44(uStack_7c,uStack_80) + uVar21;
  uVar19 = (ulong)(puVar27 + CONCAT44(uStack_7c,uStack_80) + uVar21) ^ uVar19;
  local_f8[5] = uVar19 << 0x30 | uVar19 >> 0x10;
  local_f8[0] = local_f8[5] + local_f8[0];
  uVar21 = local_f8[0] ^ uVar21;
  local_138[7] = (undefined1 *)(uVar21 << 1 | (ulong)((long)uVar21 < 0));
  puVar18 = puVar18 + CONCAT44(uStack_8c,uStack_90) + uVar28;
  uVar24 = uVar24 ^ (ulong)puVar18;
  uVar24 = uVar24 << 0x20 | uVar24 >> 0x20;
  local_f8[1] = local_f8[1] + uVar24;
  uVar28 = uVar28 ^ local_f8[1];
  uVar19 = uVar28 << 0x28 | uVar28 >> 0x18;
  local_138[3] = puVar18 + CONCAT44(uStack_9c,uStack_a0) + uVar19;
  uVar24 = (ulong)(puVar18 + CONCAT44(uStack_9c,uStack_a0) + uVar19) ^ uVar24;
  local_f8[6] = uVar24 << 0x30 | uVar24 >> 0x10;
  local_f8[1] = local_f8[6] + local_f8[1];
  uVar19 = local_f8[1] ^ uVar19;
  local_138[4] = (undefined1 *)(uVar19 << 1 | (ulong)((long)uVar19 < 0));
  for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
    S->h[lVar16] = (ulong)local_138[lVar16] ^ S->h[lVar16] ^ local_f8[lVar16];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load64( block + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = blake2b_IV[4] ^ S->t[0];
  v[13] = blake2b_IV[5] ^ S->t[1];
  v[14] = blake2b_IV[6] ^ S->f[0];
  v[15] = blake2b_IV[7] ^ S->f[1];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}